

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_tar.c
# Opt level: O2

wchar_t header_pax_extensions
                  (archive_read *a,tar *tar,archive_entry *entry,void *h,size_t *unconsumed)

{
  wchar_t wVar1;
  int iVar2;
  wchar_t wVar3;
  wchar_t wVar4;
  uint uVar5;
  size_t sVar6;
  int64_t iVar7;
  dev_t dVar8;
  long lVar9;
  archive_string_conv *sc;
  archive_string *paVar10;
  ulong uVar11;
  ulong uVar12;
  uint uVar13;
  char *fmt;
  archive_string *paVar14;
  byte *pbVar15;
  archive_string *paVar16;
  byte *size;
  size_t sVar17;
  byte *pbVar18;
  ulong uVar19;
  byte bVar20;
  byte *pbVar21;
  byte *pbVar22;
  bool bVar23;
  wchar_t local_b4;
  long local_98;
  long local_88;
  int64_t s;
  byte *local_78;
  archive_string *local_70;
  byte *local_68;
  archive_string *local_60;
  int64_t *local_58;
  archive_string *local_50;
  byte *local_48;
  archive_string *local_40;
  byte *local_38;
  
  wVar1 = read_body_to_string(a,(tar *)&tar->pax_header,(archive_string *)h,unconsumed,unconsumed);
  if (wVar1 != L'\0') {
    return wVar1;
  }
  wVar1 = tar_read_header(a,tar,entry,unconsumed);
  if ((wVar1 != L'\0') && (wVar1 != L'\xffffffec')) {
    return wVar1;
  }
  pbVar22 = (byte *)(tar->pax_header).s;
  uVar12 = (tar->pax_header).length;
  tar->pax_hdrcharset_binary = 0;
  (tar->entry_gname).length = 0;
  (tar->entry_linkpath).length = 0;
  paVar10 = &tar->entry_gname;
  (tar->entry_pathname).length = 0;
  (tar->entry_pathname_override).length = 0;
  (tar->entry_uname).length = 0;
  local_40 = &tar->entry_pathname_override;
  local_50 = &tar->entry_uname;
  local_58 = &tar->sparse_offset;
  local_b4 = L'\0';
  paVar14 = &tar->entry_pathname;
  paVar16 = &tar->entry_linkpath;
LAB_00370be3:
  if (uVar12 == 0) goto LAB_00371a7e;
  uVar19 = 0;
  uVar11 = uVar12;
  pbVar15 = pbVar22;
  while( true ) {
    bVar23 = uVar11 == 0;
    uVar11 = uVar11 - 1;
    pbVar21 = pbVar22 + uVar12;
    if ((bVar23) || (bVar20 = *pbVar15, pbVar21 = pbVar15 + 1, bVar20 == 0x20)) break;
    if ((byte)(bVar20 - 0x3a) < 0xf6) {
      fmt = "Ignoring malformed pax extended attributes";
      goto LAB_00371a48;
    }
    uVar19 = (ulong)(byte)(bVar20 - 0x30) + uVar19 * 10;
    pbVar15 = pbVar15 + 1;
    if (999999 < uVar19) {
      fmt = "Rejecting pax extended attribute > 1MB";
      goto LAB_00371a48;
    }
  }
  uVar11 = uVar19 - 1;
  if ((uVar12 <= uVar11) || (pbVar22[uVar11] != 10)) {
    fmt = "Ignoring malformed pax extended attribute";
LAB_00371a48:
    archive_set_error(&a->archive,-1,fmt);
    local_b4 = L'\xffffffec';
    goto LAB_00371a52;
  }
  pbVar22[uVar11] = 0;
  bVar20 = *pbVar21;
  if (bVar20 == 0x3d) {
    local_b4 = L'\xffffffff';
    goto LAB_00371a52;
  }
  size = pbVar22 + (uVar19 - (long)pbVar21) + -2;
  pbVar15 = pbVar21;
  while( true ) {
    pbVar18 = pbVar15 + 1;
    if (bVar20 == 0) {
      fmt = "Invalid pax extended attributes";
      goto LAB_00371a48;
    }
    if (bVar20 == 0x3d) break;
    bVar20 = *pbVar18;
    size = size + -1;
    pbVar15 = pbVar18;
  }
  *pbVar15 = 0;
  bVar20 = *pbVar21;
  wVar3 = L'\0';
  local_38 = pbVar22;
  switch(bVar20) {
  case 0x61:
    local_70 = paVar16;
    local_60 = paVar14;
    iVar2 = strcmp((char *)pbVar21,"atime");
    if (iVar2 == 0) {
      pax_time((char *)pbVar18,&s,&local_88);
      archive_entry_set_atime(entry,s,local_88);
    }
    break;
  case 0x62:
  case 100:
  case 0x65:
  case 0x66:
  case 0x69:
  case 0x6a:
  case 0x6b:
  case 0x6e:
  case 0x6f:
  case 0x71:
  case 0x72:
  case 0x74:
    local_70 = paVar16;
    local_60 = paVar14;
    goto LAB_003719d7;
  case 99:
    local_70 = paVar16;
    local_60 = paVar14;
    iVar2 = strcmp((char *)pbVar21,"ctime");
    if (iVar2 == 0) {
      pax_time((char *)pbVar18,&s,&local_88);
      archive_entry_set_ctime(entry,s,local_88);
    }
    break;
  case 0x67:
    local_70 = paVar16;
    local_60 = paVar14;
    iVar2 = strcmp((char *)pbVar21,"gid");
    if (iVar2 == 0) {
      sVar6 = strlen((char *)pbVar18);
      iVar7 = tar_atol10((char *)pbVar18,sVar6);
      archive_entry_set_gid(entry,iVar7);
    }
    else {
      iVar2 = strcmp((char *)pbVar21,"gname");
      if (iVar2 == 0) {
        (tar->entry_gname).length = 0;
        sVar6 = strlen((char *)pbVar18);
        archive_strncat(paVar10,pbVar18,sVar6);
      }
    }
    break;
  case 0x68:
    local_70 = paVar16;
    local_60 = paVar14;
    iVar2 = strcmp((char *)pbVar21,"hdrcharset");
    if (iVar2 == 0) {
      iVar2 = strcmp((char *)pbVar18,"BINARY");
      if (iVar2 == 0) {
        tar->pax_hdrcharset_binary = 1;
      }
      else {
        iVar2 = strcmp((char *)pbVar18,"ISO-IR 10646 2000 UTF-8");
        if (iVar2 == 0) {
          tar->pax_hdrcharset_binary = 0;
        }
      }
    }
    break;
  case 0x6c:
    local_70 = paVar16;
    local_60 = paVar14;
    iVar2 = strcmp((char *)pbVar21,"linkpath");
    if (iVar2 == 0) {
      (tar->entry_linkpath).length = 0;
      sVar17 = strlen((char *)pbVar18);
      paVar14 = local_70;
LAB_00371204:
      archive_strncat(paVar14,pbVar18,sVar17);
    }
    break;
  case 0x6d:
    local_70 = paVar16;
    local_60 = paVar14;
    iVar2 = strcmp((char *)pbVar21,"mtime");
    if (iVar2 == 0) {
      pax_time((char *)pbVar18,&s,&local_88);
      archive_entry_set_mtime(entry,s,local_88);
    }
    break;
  case 0x70:
    local_70 = paVar16;
    local_60 = paVar14;
    iVar2 = strcmp((char *)pbVar21,"path");
    if (iVar2 == 0) {
      (tar->entry_pathname).length = 0;
      sVar17 = strlen((char *)pbVar18);
      paVar14 = local_60;
      goto LAB_00371204;
    }
    break;
  case 0x73:
    local_70 = paVar16;
    local_60 = paVar14;
    iVar2 = strcmp((char *)pbVar21,"size");
    if (iVar2 == 0) {
      sVar6 = strlen((char *)pbVar18);
      iVar7 = tar_atol10((char *)pbVar18,sVar6);
      tar->entry_bytes_remaining = iVar7;
      if (tar->realsize_override == 0) {
        archive_entry_set_size(entry,iVar7);
        tar->realsize = tar->entry_bytes_remaining;
      }
    }
    break;
  case 0x75:
    local_70 = paVar16;
    local_60 = paVar14;
    iVar2 = strcmp((char *)pbVar21,"uid");
    if (iVar2 == 0) {
      sVar6 = strlen((char *)pbVar18);
      iVar7 = tar_atol10((char *)pbVar18,sVar6);
      archive_entry_set_uid(entry,iVar7);
    }
    else {
      iVar2 = strcmp((char *)pbVar21,"uname");
      if (iVar2 == 0) {
        (tar->entry_uname).length = 0;
        sVar17 = strlen((char *)pbVar18);
        paVar14 = local_50;
        goto LAB_00371204;
      }
    }
    break;
  default:
    if (bVar20 == 0x53) {
      local_70 = paVar16;
      local_60 = paVar14;
      iVar2 = strcmp((char *)pbVar21,"SCHILY.acl.access");
      if (iVar2 == 0) {
        wVar3 = L'Ā';
      }
      else {
        iVar2 = strcmp((char *)pbVar21,"SCHILY.acl.default");
        if (iVar2 == 0) {
          wVar3 = L'Ȁ';
        }
        else {
          iVar2 = strcmp((char *)pbVar21,"SCHILY.acl.ace");
          if (iVar2 != 0) {
            iVar2 = strcmp((char *)pbVar21,"SCHILY.devmajor");
            if (iVar2 == 0) {
              sVar6 = strlen((char *)pbVar18);
              dVar8 = tar_atol10((char *)pbVar18,sVar6);
              archive_entry_set_rdevmajor(entry,dVar8);
            }
            else {
              iVar2 = strcmp((char *)pbVar21,"SCHILY.devminor");
              if (iVar2 == 0) {
                sVar6 = strlen((char *)pbVar18);
                dVar8 = tar_atol10((char *)pbVar18,sVar6);
                archive_entry_set_rdevminor(entry,dVar8);
              }
              else {
                iVar2 = strcmp((char *)pbVar21,"SCHILY.fflags");
                if (iVar2 == 0) {
                  archive_entry_copy_fflags_text(entry,(char *)pbVar18);
                }
                else {
                  iVar2 = strcmp((char *)pbVar21,"SCHILY.dev");
                  if (iVar2 == 0) {
                    sVar6 = strlen((char *)pbVar18);
                    dVar8 = tar_atol10((char *)pbVar18,sVar6);
                    archive_entry_set_dev(entry,dVar8);
                  }
                  else {
                    iVar2 = strcmp((char *)pbVar21,"SCHILY.ino");
                    if (iVar2 == 0) {
                      sVar6 = strlen((char *)pbVar18);
                      iVar7 = tar_atol10((char *)pbVar18,sVar6);
                      archive_entry_set_ino(entry,iVar7);
                    }
                    else {
                      iVar2 = strcmp((char *)pbVar21,"SCHILY.nlink");
                      if (iVar2 == 0) {
                        sVar6 = strlen((char *)pbVar18);
                        iVar7 = tar_atol10((char *)pbVar18,sVar6);
                        archive_entry_set_nlink(entry,(uint)iVar7);
                      }
                      else {
                        iVar2 = strcmp((char *)pbVar21,"SCHILY.realsize");
                        if (iVar2 == 0) {
                          sVar6 = strlen((char *)pbVar18);
                          iVar7 = tar_atol10((char *)pbVar18,sVar6);
                          tar->realsize = iVar7;
                          tar->realsize_override = 1;
                          archive_entry_set_size(entry,iVar7);
                        }
                        else {
                          iVar2 = strncmp((char *)pbVar21,"SCHILY.xattr.",0xd);
                          if (iVar2 == 0) {
                            sVar6 = strlen((char *)pbVar21);
                            if ((0xd < sVar6) &&
                               (iVar2 = bcmp(pbVar21,"SCHILY.xattr.",0xd), iVar2 == 0)) {
                              archive_entry_xattr_add_entry
                                        (entry,(char *)(pbVar21 + 0xd),pbVar18,(size_t)size);
                            }
                          }
                          else {
                            iVar2 = strcmp((char *)pbVar21,"SUN.holesdata");
                            if (iVar2 == 0) {
                              if (*pbVar18 != 0x20) {
LAB_00371a00:
                                archive_set_error(&a->archive,-1,"Parse error: SUN.holesdata");
LAB_00371840:
                                wVar3 = L'\xffffffec';
                                goto LAB_003719d7;
                              }
                              local_98 = 0;
                              local_78 = (byte *)CONCAT44(local_78._4_4_,1);
                              do {
                                pbVar18 = pbVar18 + 1;
                                for (sVar17 = 0; bVar20 = pbVar18[sVar17], (bVar20 & 0xdf) != 0;
                                    sVar17 = sVar17 + 1) {
                                  if ((byte)(bVar20 - 0x3a) < 0xf6) goto LAB_00371a00;
                                }
                                iVar7 = tar_atol10((char *)pbVar18,sVar17);
                                if (iVar7 < 0) goto LAB_00371a00;
                                pbVar18 = pbVar18 + sVar17;
                                if (iVar7 - local_98 != 0 && local_98 <= iVar7) {
                                  wVar3 = gnu_add_sparse_entry(a,tar,local_98,iVar7 - local_98);
                                  if (wVar3 != L'\0') goto LAB_00371c18;
                                  tar->sparse_last->hole = (int)local_78;
                                  bVar20 = *pbVar18;
                                }
                                local_78 = (byte *)((ulong)local_78 ^ 1);
                                local_98 = iVar7;
                              } while (bVar20 != 0);
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
            break;
          }
          wVar3 = L'㰀';
        }
      }
      wVar4 = pax_attribute_acl(a,tar,entry,(char *)pbVar18,wVar3);
      wVar3 = L'\0';
      if (wVar4 != L'\xffffffe2') goto LAB_003719d7;
      goto LAB_00371c18;
    }
    if (bVar20 != 0x4c) {
      local_70 = paVar16;
      local_60 = paVar14;
      if (bVar20 != 0x47) goto LAB_003719d7;
      iVar2 = strncmp((char *)pbVar21,"GNU.sparse",10);
      if ((iVar2 != 0) || (tar->sparse_allowed != 0)) {
        iVar2 = strcmp((char *)pbVar21,"GNU.sparse.numblocks");
        if (iVar2 == 0) {
          *(undefined4 *)local_58 = 0xffffffff;
          *(undefined4 *)((long)local_58 + 4) = 0xffffffff;
          *(undefined4 *)(local_58 + 1) = 0xffffffff;
          *(undefined4 *)((long)local_58 + 0xc) = 0xffffffff;
          tar->sparse_gnu_major = 0;
          tar->sparse_gnu_minor = 0;
        }
        iVar2 = strcmp((char *)pbVar21,"GNU.sparse.offset");
        if (iVar2 == 0) {
          sVar6 = strlen((char *)pbVar18);
          iVar7 = tar_atol10((char *)pbVar18,sVar6);
          tar->sparse_offset = iVar7;
          if (tar->sparse_numbytes != -1) {
            wVar3 = gnu_add_sparse_entry(a,tar,iVar7,tar->sparse_numbytes);
            if (wVar3 != L'\0') goto LAB_00371c18;
            *(undefined4 *)local_58 = 0xffffffff;
            *(undefined4 *)((long)local_58 + 4) = 0xffffffff;
            *(undefined4 *)(local_58 + 1) = 0xffffffff;
            *(undefined4 *)((long)local_58 + 0xc) = 0xffffffff;
          }
        }
        iVar2 = strcmp((char *)pbVar21,"GNU.sparse.numbytes");
        if (iVar2 == 0) {
          sVar6 = strlen((char *)pbVar18);
          iVar7 = tar_atol10((char *)pbVar18,sVar6);
          tar->sparse_numbytes = iVar7;
          if (iVar7 != -1) {
            wVar3 = gnu_add_sparse_entry(a,tar,tar->sparse_offset,iVar7);
            if (wVar3 != L'\0') goto LAB_00371c18;
            *(undefined4 *)local_58 = 0xffffffff;
            *(undefined4 *)((long)local_58 + 4) = 0xffffffff;
            *(undefined4 *)(local_58 + 1) = 0xffffffff;
            *(undefined4 *)((long)local_58 + 0xc) = 0xffffffff;
          }
        }
        iVar2 = strcmp((char *)pbVar21,"GNU.sparse.size");
        if (iVar2 == 0) {
          sVar6 = strlen((char *)pbVar18);
          iVar7 = tar_atol10((char *)pbVar18,sVar6);
          tar->realsize = iVar7;
          archive_entry_set_size(entry,iVar7);
          tar->realsize_override = 1;
        }
        iVar2 = strcmp((char *)pbVar21,"GNU.sparse.map");
        if (iVar2 == 0) {
          tar->sparse_gnu_major = 0;
          tar->sparse_gnu_minor = 1;
          pbVar22 = (byte *)0xffffffffffffffff;
          pbVar15 = pbVar18;
          do {
            for (sVar17 = 0; (bVar20 = pbVar15[sVar17], bVar20 != 0 && (bVar20 != 0x2c));
                sVar17 = sVar17 + 1) {
              if ((byte)(bVar20 - 0x3a) < 0xf6) {
                wVar3 = L'\xffffffec';
                goto LAB_003719d7;
              }
            }
            local_78 = pbVar22;
            local_68 = pbVar15;
            pbVar22 = (byte *)tar_atol10((char *)pbVar15,sVar17);
            if ((long)local_78 < 0) {
              if ((long)pbVar22 < 0) goto LAB_00371840;
            }
            else {
              if (((long)pbVar22 < 0) ||
                 (wVar3 = gnu_add_sparse_entry(a,tar,(int64_t)local_78,(int64_t)pbVar22),
                 wVar3 != L'\0')) goto LAB_00371840;
              bVar20 = local_68[sVar17];
              pbVar22 = (byte *)0xffffffffffffffff;
            }
            pbVar15 = local_68 + sVar17 + 1;
          } while (bVar20 != 0);
        }
        iVar2 = strcmp((char *)pbVar21,"GNU.sparse.major");
        if (iVar2 == 0) {
          sVar6 = strlen((char *)pbVar18);
          iVar7 = tar_atol10((char *)pbVar18,sVar6);
          tar->sparse_gnu_major = (int)iVar7;
          tar->sparse_gnu_pending = '\x01';
        }
        iVar2 = strcmp((char *)pbVar21,"GNU.sparse.minor");
        if (iVar2 == 0) {
          sVar6 = strlen((char *)pbVar18);
          iVar7 = tar_atol10((char *)pbVar18,sVar6);
          tar->sparse_gnu_minor = (int)iVar7;
          tar->sparse_gnu_pending = '\x01';
        }
        iVar2 = strcmp((char *)pbVar21,"GNU.sparse.name");
        if (iVar2 == 0) {
          (tar->entry_pathname_override).length = 0;
          sVar6 = strlen((char *)pbVar18);
          archive_strncat(local_40,pbVar18,sVar6);
        }
        iVar2 = strcmp((char *)pbVar21,"GNU.sparse.realsize");
        if (iVar2 == 0) {
          sVar6 = strlen((char *)pbVar18);
          iVar7 = tar_atol10((char *)pbVar18,sVar6);
          tar->realsize = iVar7;
          archive_entry_set_size(entry,iVar7);
          tar->realsize_override = 1;
        }
        break;
      }
      archive_set_error(&a->archive,-1,"Non-regular file cannot be sparse");
      goto LAB_00371c18;
    }
    local_70 = paVar16;
    local_60 = paVar14;
    iVar2 = strcmp((char *)pbVar21,"LIBARCHIVE.creationtime");
    if (iVar2 == 0) {
      pax_time((char *)pbVar18,&s,&local_88);
      archive_entry_set_birthtime(entry,s,local_88);
    }
    iVar2 = bcmp(pbVar21,"LIBARCHIVE.xattr.",0x11);
    if (((iVar2 == 0) && (sVar6 = strlen((char *)pbVar21), 0x11 < sVar6)) &&
       (iVar2 = bcmp(pbVar21,"LIBARCHIVE.xattr.",0x11), iVar2 == 0)) {
      pbVar21 = pbVar21 + 0x11;
      sVar6 = strlen((char *)pbVar21);
      pbVar22 = (byte *)malloc(sVar6 + 1);
      pbVar15 = pbVar22;
      if (pbVar22 != (byte *)0x0) {
        do {
          local_48 = pbVar15;
          bVar20 = *pbVar21;
          if (bVar20 == 0x25) {
            if ((pbVar21[1] == 0) || (pbVar21[2] == 0)) goto LAB_00371501;
            local_68 = (byte *)CONCAT44(local_68._4_4_,(int)(char)pbVar21[2]);
            local_78 = pbVar22;
            wVar3 = tohex((int)(char)pbVar21[1]);
            wVar4 = tohex((wchar_t)local_68);
            pbVar22 = local_78;
            if ((wVar3 | wVar4) < 0) goto LAB_00371501;
            pbVar21 = pbVar21 + 3;
            bVar20 = (byte)(wVar3 << 4) | (byte)wVar4;
          }
          else {
            if (bVar20 == 0) goto LAB_0037173a;
LAB_00371501:
            pbVar21 = pbVar21 + 1;
          }
          *pbVar22 = bVar20;
          pbVar22 = pbVar22 + 1;
          pbVar15 = local_48;
        } while( true );
      }
    }
  }
LAB_003719d0:
  wVar3 = L'\0';
LAB_003719d7:
  pbVar22 = local_38 + uVar19;
  if (wVar3 <= local_b4) {
    local_b4 = wVar3;
  }
  uVar12 = uVar12 - uVar19;
  paVar14 = local_60;
  paVar16 = local_70;
  goto LAB_00370be3;
LAB_0037173a:
  *pbVar22 = 0;
  sVar6 = strlen((char *)pbVar18);
  if (base64_decode_decode_table[0x42] != '\x01') {
    base64_decode_decode_table._112_4_ = 0xffffffff;
    base64_decode_decode_table._116_4_ = 0xffffffff;
    base64_decode_decode_table._120_4_ = 0xffffffff;
    base64_decode_decode_table._124_4_ = 0xffffffff;
    base64_decode_decode_table._96_4_ = 0xffffffff;
    base64_decode_decode_table._100_4_ = 0xffffffff;
    base64_decode_decode_table._104_4_ = 0xffffffff;
    base64_decode_decode_table._108_4_ = 0xffffffff;
    base64_decode_decode_table._80_4_ = 0xffffffff;
    base64_decode_decode_table._84_4_ = 0xffffffff;
    base64_decode_decode_table._88_4_ = 0xffffffff;
    base64_decode_decode_table._92_4_ = 0xffffffff;
    base64_decode_decode_table._64_4_ = 0xffffffff;
    base64_decode_decode_table._68_4_ = 0xffffffff;
    base64_decode_decode_table._72_4_ = 0xffffffff;
    base64_decode_decode_table._76_4_ = 0xffffffff;
    base64_decode_decode_table._48_4_ = 0xffffffff;
    base64_decode_decode_table._52_4_ = 0xffffffff;
    base64_decode_decode_table._56_4_ = 0xffffffff;
    base64_decode_decode_table._60_4_ = 0xffffffff;
    base64_decode_decode_table._32_4_ = 0xffffffff;
    base64_decode_decode_table._36_4_ = 0xffffffff;
    base64_decode_decode_table._40_4_ = 0xffffffff;
    base64_decode_decode_table._44_4_ = 0xffffffff;
    base64_decode_decode_table._16_4_ = 0xffffffff;
    base64_decode_decode_table._20_4_ = 0xffffffff;
    base64_decode_decode_table._24_4_ = 0xffffffff;
    base64_decode_decode_table._28_4_ = 0xffffffff;
    base64_decode_decode_table._0_4_ = 0xffffffff;
    base64_decode_decode_table._4_4_ = 0xffffffff;
    base64_decode_decode_table._8_4_ = 0xffffffff;
    base64_decode_decode_table._12_4_ = 0xffffffff;
    for (lVar9 = 0; lVar9 != 0x40; lVar9 = lVar9 + 1) {
      base64_decode_decode_table[(byte)(&base64_decode_digits)[lVar9]] = (char)lVar9;
    }
  }
  pbVar21 = (byte *)malloc((sVar6 - (sVar6 >> 2)) + 1);
  pbVar22 = local_48;
  pbVar15 = pbVar21;
  if (pbVar21 != (byte *)0x0) {
    while (sVar6 != 0) {
      uVar13 = 0;
      uVar5 = 0;
      while( true ) {
        if ((3 < uVar5) || (sVar6 == 0)) goto LAB_003717ef;
        bVar20 = *pbVar18;
        if ((bVar20 == 0x3d) || (bVar20 == 0x5f)) break;
        if (((char)bVar20 < ' ') || ((byte)base64_decode_decode_table[bVar20] == 0xff)) {
          pbVar18 = pbVar18 + 1;
          sVar6 = sVar6 - 1;
        }
        else {
          pbVar18 = pbVar18 + 1;
          uVar13 = uVar13 << 6 | (uint)(byte)base64_decode_decode_table[bVar20];
          sVar6 = sVar6 - 1;
          uVar5 = uVar5 + 1;
        }
      }
      sVar6 = 0;
LAB_003717ef:
      iVar2 = uVar13 << (('\x04' - (char)uVar5) * '\x06' & 0x1fU);
      if (uVar5 == 2) {
LAB_00371813:
        *pbVar15 = (byte)((uint)iVar2 >> 0x10);
      }
      else {
        if (uVar5 == 3) {
LAB_00371810:
          pbVar15[1] = (byte)((uint)iVar2 >> 8);
          goto LAB_00371813;
        }
        if (uVar5 == 4) {
          pbVar15[2] = (byte)iVar2;
          goto LAB_00371810;
        }
      }
      pbVar15 = pbVar15 + (uVar5 * 3 >> 2);
    }
    archive_entry_xattr_add_entry(entry,(char *)local_48,pbVar21,(long)pbVar15 - (long)pbVar21);
    free(pbVar22);
    pbVar22 = pbVar21;
  }
  free(pbVar22);
  goto LAB_003719d0;
LAB_00371a7e:
  if (tar->pax_hdrcharset_binary == 0) {
    local_70 = paVar16;
    local_60 = paVar14;
    sc = archive_string_conversion_from_charset(&a->archive,"UTF-8",L'\x01');
    if (sc != (archive_string_conv *)0x0) {
      if (tar->compat_2x != 0) {
        archive_string_conversion_set_opt(sc,L'\x01');
      }
      goto LAB_00371ae8;
    }
  }
  else {
    sc = tar->opt_sconv;
    local_70 = paVar16;
    local_60 = paVar14;
LAB_00371ae8:
    sVar17 = (tar->entry_gname).length;
    if ((sVar17 != 0) &&
       (wVar3 = _archive_entry_copy_gname_l(entry,paVar10->s,sVar17,sc), wVar3 != L'\0')) {
      local_b4 = set_conversion_failed_error(a,sc,"Gname");
      if (local_b4 == L'\xffffffe2') goto LAB_00371c18;
      archive_entry_copy_gname(entry,paVar10->s);
    }
    sVar17 = (tar->entry_linkpath).length;
    if ((sVar17 != 0) &&
       (wVar3 = _archive_entry_copy_link_l(entry,local_70->s,sVar17,sc), wVar3 != L'\0')) {
      local_b4 = set_conversion_failed_error(a,sc,"Linkname");
      if (local_b4 == L'\xffffffe2') goto LAB_00371c18;
      archive_entry_copy_link(entry,local_70->s);
    }
    paVar10 = local_40;
    if ((((tar->entry_pathname_override).length != 0) ||
        (paVar10 = local_60, (tar->entry_pathname).length != 0)) &&
       (wVar3 = _archive_entry_copy_pathname_l(entry,paVar10->s,paVar10->length,sc), wVar3 != L'\0')
       ) {
      local_b4 = set_conversion_failed_error(a,sc,"Pathname");
      if (local_b4 == L'\xffffffe2') goto LAB_00371c18;
      archive_entry_copy_pathname(entry,paVar10->s);
    }
    sVar17 = (tar->entry_uname).length;
    if ((sVar17 == 0) ||
       (wVar3 = _archive_entry_copy_uname_l(entry,local_50->s,sVar17,sc), wVar3 == L'\0'))
    goto LAB_00371a52;
    local_b4 = set_conversion_failed_error(a,sc,"Uname");
    if (local_b4 != L'\xffffffe2') {
      archive_entry_copy_uname(entry,local_50->s);
      goto LAB_00371a52;
    }
  }
LAB_00371c18:
  local_b4 = L'\xffffffe2';
LAB_00371a52:
  if (wVar1 < local_b4) {
    local_b4 = wVar1;
  }
  tar->entry_padding = (ulong)(-(int)tar->entry_bytes_remaining & 0x1ff);
  return local_b4;
}

Assistant:

static int
header_pax_extensions(struct archive_read *a, struct tar *tar,
    struct archive_entry *entry, const void *h, size_t *unconsumed)
{
	int err, err2;

	err = read_body_to_string(a, tar, &(tar->pax_header), h, unconsumed);
	if (err != ARCHIVE_OK)
		return (err);

	/* Parse the next header. */
	err = tar_read_header(a, tar, entry, unconsumed);
	if ((err != ARCHIVE_OK) && (err != ARCHIVE_WARN))
		return (err);

	/*
	 * TODO: Parse global/default options into 'entry' struct here
	 * before handling file-specific options.
	 *
	 * This design (parse standard header, then overwrite with pax
	 * extended attribute data) usually works well, but isn't ideal;
	 * it would be better to parse the pax extended attributes first
	 * and then skip any fields in the standard header that were
	 * defined in the pax header.
	 */
	err2 = pax_header(a, tar, entry, &tar->pax_header);
	err =  err_combine(err, err2);
	tar->entry_padding = 0x1ff & (-tar->entry_bytes_remaining);
	return (err);
}